

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall helics::apps::Player::loadTextFile(Player *this,string *filename)

{
  vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *this_00;
  int iVar1;
  pointer pMVar2;
  string_view bracketChars;
  bool bVar3;
  int iVar4;
  long lVar5;
  Time TVar6;
  size_type sVar7;
  ostream *poVar8;
  pointer pVVar9;
  char *pcVar10;
  vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  initializer_list<char> __l;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view line;
  string_view whitespace;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string_view input_03;
  string_view input_04;
  string_view whitespace_00;
  string_view whitespace_01;
  string_view whitespace_02;
  string_view whitespace_03;
  string_view whitespace_04;
  string_view whitespace_05;
  delimiter_compression in_stack_fffffffffffffb48;
  int lineNumber;
  ulong local_4a8;
  undefined1 local_4a0 [40];
  stringVector blk;
  undefined4 local_448;
  string local_440;
  vector<int,_std::allocator<int>_> cnts;
  string str;
  AppTextParser aparser;
  
  AppTextParser::AppTextParser(&aparser,filename);
  local_4a0._0_2_ = 0x4d6d;
  __l._M_len = 2;
  __l._M_array = local_4a0;
  CLI::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&str,__l,(allocator_type *)&local_440);
  AppTextParser::preParseFile(&cnts,&aparser,(vector<char,_std::allocator<char>_> *)&str);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&str);
  iVar4 = cnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[1];
  iVar1 = cnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[2];
  this_00 = &this->points;
  local_4a8 = (long)(this->points).
                    super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->points).
                    super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 7;
  CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::resize
            (this_00,((long)*cnts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start -
                     (long)(int)((long)iVar1 + (long)iVar4)) + local_4a8);
  this_01 = &this->messages;
  _local_448 = ((long)(this->messages).
                      super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->messages).
                     super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x110;
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  resize(this_01,(long)iVar1 + (long)iVar4 + _local_448);
  AppTextParser::reset(&aparser);
  if (aparser.configStr._M_string_length != 0) {
    App::loadConfigOptions(&this->super_App,&aparser);
    generateParser((Player *)local_4a0);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&str,(string *)&aparser.configStr,_S_in);
    CLI::App::parse_from_stream((App *)CONCAT62(local_4a0._2_6_,local_4a0._0_2_),(istream *)&str);
    std::__cxx11::istringstream::~istringstream((istringstream *)&str);
    if ((long *)CONCAT62(local_4a0._2_6_,local_4a0._0_2_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT62(local_4a0._2_6_,local_4a0._0_2_) + 8))();
    }
  }
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  local_4a0._32_8_ = this_01;
  do {
    bVar3 = AppTextParser::loadNextLine(&aparser,&str,&lineNumber);
    if (!bVar3) {
      std::__cxx11::string::~string((string *)&str);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&cnts);
      AppTextParser::~AppTextParser(&aparser);
      return;
    }
    pcVar10 = (char *)0x3;
    pcVar11 = (char *)0x0;
    bracketChars._M_str = (char *)0x38cc65;
    bracketChars._M_len = 7;
    line._M_str = (char *)0x3;
    line._M_len = (size_t)str._M_dataplus._M_p;
    gmlc::utilities::stringOps::splitlineBracket_abi_cxx11_
              (&blk,(stringOps *)str._M_string_length,line,(string_view)ZEXT816(0x38cb33),
               bracketChars,in_stack_fffffffffffffb48);
    whitespace._M_str = pcVar10;
    whitespace._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
    gmlc::utilities::stringOps::trimString
              ((stringOps *)
               blk.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(string *)0x8,whitespace);
    if ((byte)(*((blk.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p | 0x20U) == 0x6d) {
      lVar5 = (long)blk.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)blk.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar13 = (long)(int)local_448;
      if (lVar5 == 5) {
        str_03._M_str =
             blk.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        str_03._M_len =
             blk.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
        TVar6 = extractTime(this,str_03,lineNumber);
        pMVar2 = (this_01->
                 super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar2[lVar13].sendTime.internalTimeCode = TVar6.internalTimeCode;
        if (TVar6.internalTimeCode != -0x7fffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&pMVar2[lVar13].mess.source,
                     blk.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&(this_01->
                      super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar13].mess.dest,
                     blk.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3);
          pMVar2 = (this_01->
                   super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pMVar2[lVar13].mess.time.internalTimeCode = pMVar2[lVar13].sendTime.internalTimeCode;
          decode((string *)local_4a0,
                 (string *)
                 (blk.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4));
          SmallBuffer::operator=
                    (&(this_01->
                      super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar13].mess.data,
                     (string *)local_4a0);
LAB_00221afb:
          std::__cxx11::string::~string((string *)local_4a0);
          goto LAB_00221b35;
        }
      }
      else if (lVar5 == 6) {
        str_00._M_str =
             blk.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        str_00._M_len =
             blk.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
        TVar6 = extractTime(this,str_00,lineNumber);
        pMVar2 = (this_01->
                 super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar2[lVar13].sendTime.internalTimeCode = TVar6.internalTimeCode;
        if (TVar6.internalTimeCode != -0x7fffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&pMVar2[lVar13].mess.source,
                     blk.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&(this_01->
                      super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar13].mess.dest,
                     blk.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4);
          str_01._M_str =
               blk.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          str_01._M_len =
               blk.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length;
          TVar6 = extractTime(this,str_01,lineNumber);
          (this_01->
          super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
          )._M_impl.super__Vector_impl_data._M_start[lVar13].mess.time.internalTimeCode =
               TVar6.internalTimeCode;
          if (TVar6.internalTimeCode != -0x7fffffffffffffff) {
            decode((string *)local_4a0,
                   (string *)
                   (blk.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 5));
            SmallBuffer::operator=
                      (&(this_01->
                        super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar13].mess.data,
                       (string *)local_4a0);
            goto LAB_00221afb;
          }
        }
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cerr,"unknown message format line ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,lineNumber);
        std::operator<<(poVar8,'\n');
LAB_00221b35:
        _local_448 = ZEXT48(local_448 + 1);
      }
    }
    else {
      lVar5 = (long)blk.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)blk.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar14 = (ulong)(int)local_4a8;
      uVar12 = local_4a8 & 0xffffffff;
      if (lVar5 == 4) {
        sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        blk.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,':',0xffffffffffffffff);
        if (sVar7 == 0xffffffffffffffff) {
          input_03._M_str = (char *)0x8;
          input_03._M_len =
               (size_t)((blk.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          whitespace_04._M_str = pcVar11;
          whitespace_04._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_4a0,
                     (stringOps *)
                     (blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,input_03,
                     whitespace_04);
          str_07._M_str._2_6_ = local_4a0._2_6_;
          str_07._M_str._0_2_ = local_4a0._0_2_;
          str_07._M_len = local_4a0._8_8_;
          TVar6 = extractTime(this,str_07,lineNumber);
          (this_00->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[(int)local_4a8].time.internalTimeCode =
               TVar6.internalTimeCode;
          std::__cxx11::string::~string((string *)local_4a0);
          this_01 = (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                     *)local_4a0._32_8_;
          if (TVar6.internalTimeCode != -0x7fffffffffffffff) goto LAB_00221f0b;
        }
        else {
          input_01._M_str = (char *)0x8;
          input_01._M_len =
               (size_t)((blk.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          whitespace_02._M_str = pcVar11;
          whitespace_02._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    (&local_440,
                     (stringOps *)
                     (blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,input_01,
                     whitespace_02);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                     &local_440,0,sVar7);
          str_05._M_str._2_6_ = local_4a0._2_6_;
          str_05._M_str._0_2_ = local_4a0._0_2_;
          str_05._M_len = local_4a0._8_8_;
          TVar6 = extractTime(this,str_05,lineNumber);
          (this_00->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[uVar14].time.internalTimeCode =
               TVar6.internalTimeCode;
          std::__cxx11::string::~string((string *)local_4a0);
          std::__cxx11::string::~string((string *)&local_440);
          this_01 = (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                     *)local_4a0._32_8_;
          if (TVar6.internalTimeCode != -0x7fffffffffffffff) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a0,
                       blk.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,sVar7 + 1,0xffffffffffffffff);
            iVar4 = CLI::std::__cxx11::stoi((string *)local_4a0,(size_t *)0x0,10);
            (this_00->
            super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar14].iteration = iVar4;
            std::__cxx11::string::~string((string *)local_4a0);
LAB_00221f0b:
            if ((blk.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) &&
               (0 < (int)local_4a8)) {
              pVVar9 = (this_00->
                       super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &pVVar9[uVar12].pubName,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &pVVar9[uVar12 - 1].pubName);
              uVar14 = uVar12;
            }
            else {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &(this_00->
                         super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar14].pubName,
                        blk.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &(this_00->
                       super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar14].type,
                      blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2);
            decode((string *)local_4a0,
                   (string *)
                   (blk.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 3));
            std::
            variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
            ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         *)&(this_00->
                            super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar14].value,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4a0);
LAB_00222045:
            std::__cxx11::string::~string((string *)local_4a0);
            local_4a8 = (ulong)((int)local_4a8 + 1);
            this_01 = (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                       *)local_4a0._32_8_;
          }
        }
      }
      else if (lVar5 == 3) {
        sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        blk.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,':',0xffffffffffffffff);
        if (sVar7 == 0xffffffffffffffff) {
          input_02._M_str = (char *)0x8;
          input_02._M_len =
               (size_t)((blk.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          whitespace_03._M_str = pcVar11;
          whitespace_03._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_4a0,
                     (stringOps *)
                     (blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,input_02,
                     whitespace_03);
          str_06._M_str._2_6_ = local_4a0._2_6_;
          str_06._M_str._0_2_ = local_4a0._0_2_;
          str_06._M_len = local_4a0._8_8_;
          TVar6 = extractTime(this,str_06,lineNumber);
          (this_00->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[uVar14].time.internalTimeCode =
               TVar6.internalTimeCode;
          std::__cxx11::string::~string((string *)local_4a0);
          this_01 = (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                     *)local_4a0._32_8_;
          if (TVar6.internalTimeCode != -0x7fffffffffffffff) goto LAB_00221d94;
        }
        else {
          input_00._M_str = (char *)0x8;
          input_00._M_len =
               (size_t)((blk.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          whitespace_01._M_str = pcVar11;
          whitespace_01._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    (&local_440,
                     (stringOps *)
                     (blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,input_00,
                     whitespace_01);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                     &local_440,0,sVar7);
          str_04._M_str._2_6_ = local_4a0._2_6_;
          str_04._M_str._0_2_ = local_4a0._0_2_;
          str_04._M_len = local_4a0._8_8_;
          TVar6 = extractTime(this,str_04,lineNumber);
          (this_00->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[uVar14].time.internalTimeCode =
               TVar6.internalTimeCode;
          std::__cxx11::string::~string((string *)local_4a0);
          std::__cxx11::string::~string((string *)&local_440);
          this_01 = (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                     *)local_4a0._32_8_;
          if (TVar6.internalTimeCode != -0x7fffffffffffffff) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a0,
                       blk.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,sVar7 + 1,0xffffffffffffffff);
            iVar4 = CLI::std::__cxx11::stoi((string *)local_4a0,(size_t *)0x0,10);
            (this_00->
            super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar14].iteration = iVar4;
            std::__cxx11::string::~string((string *)local_4a0);
LAB_00221d94:
            if ((blk.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) &&
               (0 < (int)local_4a8)) {
              pVVar9 = (this_00->
                       super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar5 = uVar12 * 0x80;
              __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pVVar9[uVar12 - 1].pubName;
            }
            else {
              __str = blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
              pVVar9 = (this_00->
                       super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              lVar5 = uVar14 << 7;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pVVar9->pubName)._M_dataplus._M_p + lVar5),__str);
            decode((string *)local_4a0,
                   (string *)
                   (blk.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2));
LAB_0022202a:
            std::
            variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
            ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                         *)&(this_00->
                            super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar14].value,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_4a0);
            goto LAB_00222045;
          }
        }
      }
      else if (lVar5 == 2) {
        sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        blk.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,':',0xffffffffffffffff);
        if (sVar7 == 0xffffffffffffffff) {
          input_04._M_str = (char *)0x8;
          input_04._M_len =
               (size_t)((blk.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          whitespace_05._M_str = pcVar11;
          whitespace_05._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    ((string *)local_4a0,
                     (stringOps *)
                     (blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,input_04,
                     whitespace_05);
          str_08._M_str._2_6_ = local_4a0._2_6_;
          str_08._M_str._0_2_ = local_4a0._0_2_;
          str_08._M_len = local_4a0._8_8_;
          TVar6 = extractTime(this,str_08,lineNumber);
          (this_00->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[uVar14].time.internalTimeCode =
               TVar6.internalTimeCode;
          std::__cxx11::string::~string((string *)local_4a0);
          this_01 = (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                     *)local_4a0._32_8_;
          if (TVar6.internalTimeCode != -0x7fffffffffffffff) goto LAB_00221e9a;
        }
        else {
          input._M_str = (char *)0x8;
          input._M_len = (size_t)((blk.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          whitespace_00._M_str = pcVar11;
          whitespace_00._M_len = (size_t)&gmlc::utilities::stringOps::whiteChars;
          gmlc::utilities::stringOps::trim_abi_cxx11_
                    (&local_440,
                     (stringOps *)
                     (blk.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,input,
                     whitespace_00);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0,
                     &local_440,0,sVar7);
          str_02._M_str._2_6_ = local_4a0._2_6_;
          str_02._M_str._0_2_ = local_4a0._0_2_;
          str_02._M_len = local_4a0._8_8_;
          TVar6 = extractTime(this,str_02,lineNumber);
          (this_00->
          super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>)
          ._M_impl.super__Vector_impl_data._M_start[uVar14].time.internalTimeCode =
               TVar6.internalTimeCode;
          std::__cxx11::string::~string((string *)local_4a0);
          std::__cxx11::string::~string((string *)&local_440);
          this_01 = (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                     *)local_4a0._32_8_;
          if (TVar6.internalTimeCode != -0x7fffffffffffffff) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a0,
                       blk.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,sVar7 + 1,0xffffffffffffffff);
            iVar4 = CLI::std::__cxx11::stoi((string *)local_4a0,(size_t *)0x0,10);
            (this_00->
            super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar14].iteration = iVar4;
            std::__cxx11::string::~string((string *)local_4a0);
LAB_00221e9a:
            if ((int)local_4a8 < 1) {
              poVar8 = std::operator<<((ostream *)&std::cerr,
                                       "lines without publication name but follow one with a publication line "
                                      );
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,lineNumber);
              std::operator<<(poVar8,'\n');
            }
            else {
              pVVar9 = (this_00->
                       super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &pVVar9[uVar12].pubName,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &pVVar9[uVar12 - 1].pubName);
            }
            decode((string *)local_4a0,
                   (string *)
                   (blk.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
            goto LAB_0022202a;
          }
        }
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cerr,"unknown publish format line ");
        this_01 = (vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   *)local_4a0._32_8_;
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,lineNumber);
        std::operator<<(poVar8,'\n');
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&blk);
  } while( true );
}

Assistant:

void Player::loadTextFile(const std::string& filename)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT

    AppTextParser aparser(filename);
    auto cnts = aparser.preParseFile({'m', 'M'});

    int mcnt = cnts[1] + cnts[2];
    int pcnt = cnts[0] - mcnt;
    int pIndex = static_cast<int>(points.size());
    points.resize(points.size() + pcnt);
    int mIndex = static_cast<int>(messages.size());
    messages.resize(messages.size() + mcnt);

    aparser.reset();

    if (!aparser.configString().empty()) {
        App::loadConfigOptions(aparser);
        auto app = generateParser();
        std::istringstream sstr(aparser.configString());
        app->parse_from_stream(sstr);
    }
    std::string str;
    int lineNumber;
    while (aparser.loadNextLine(str, lineNumber)) {
        /* time key type value units*/
        auto blk = splitlineBracket(str, ",\t ", default_bracket_chars, delimiter_compression::on);

        trimString(blk[0]);
        if ((blk[0].front() == 'm') || (blk[0].front() == 'M')) {
            // deal with messages
            switch (blk.size()) {
                case 5:
                    if ((messages[mIndex].sendTime = extractTime(blk[1], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }

                    messages[mIndex].mess.source = blk[2];
                    messages[mIndex].mess.dest = blk[3];
                    messages[mIndex].mess.time = messages[mIndex].sendTime;
                    messages[mIndex].mess.data = decode(std::move(blk[4]));
                    break;
                case 6:
                    if ((messages[mIndex].sendTime = extractTime(blk[1], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }

                    messages[mIndex].mess.source = blk[3];
                    messages[mIndex].mess.dest = blk[4];
                    if ((messages[mIndex].mess.time = extractTime(blk[2], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                    messages[mIndex].mess.data = decode(std::move(blk[5]));
                    break;
                default:
                    std::cerr << "unknown message format line " << lineNumber << '\n';
                    break;
            }
            ++mIndex;
        } else {
            if (blk.size() == 2) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if (pIndex > 0) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    std::cerr
                        << "lines without publication name but follow one with a publication line "
                        << lineNumber << '\n';
                }
                points[pIndex].value = decode(std::move(blk[1]));
                ++pIndex;
            } else if (blk.size() == 3) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if ((blk[1].empty()) && (pIndex > 0)) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    points[pIndex].pubName = blk[1];
                }

                points[pIndex].value = decode(std::move(blk[2]));
                ++pIndex;
            } else if (blk.size() == 4) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if ((blk[1].empty()) && (pIndex > 0)) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    points[pIndex].pubName = blk[1];
                }
                points[pIndex].type = blk[2];
                points[pIndex].value = decode(std::move(blk[3]));
                ++pIndex;
            } else {
                std::cerr << "unknown publish format line " << lineNumber << '\n';
            }
        }
    }
}